

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_path_line_to(nk_draw_list *list,nk_vec2 pos)

{
  nk_handle texture;
  nk_draw_command *pnVar1;
  nk_vec2 *pnVar2;
  nk_rect rect;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2174,"void nk_draw_list_path_line_to(struct nk_draw_list *, struct nk_vec2)");
  }
  if (list->cmd_count == 0) {
    rect.w = 16384.0;
    rect.h = 16384.0;
    rect.x = -8192.0;
    rect.y = -8192.0;
    nk_draw_list_add_clip(list,rect);
  }
  pnVar1 = nk_draw_list_command_last(list);
  if ((pnVar1 != (nk_draw_command *)0x0) &&
     (texture = (list->config).null.texture, (pnVar1->texture).ptr != texture.ptr)) {
    nk_draw_list_push_image(list,texture);
  }
  pnVar2 = (nk_vec2 *)nk_buffer_alloc(list->buffer,NK_BUFFER_FRONT,8,4);
  if (pnVar2 != (nk_vec2 *)0x0) {
    if (list->path_offset == 0) {
      if (list->buffer == (nk_buffer *)0x0) {
        __assert_fail("buffer",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x1a63,"void *nk_buffer_memory(struct nk_buffer *)");
      }
      list->path_offset = (int)pnVar2 - *(int *)&(list->buffer->memory).ptr;
    }
    list->path_count = list->path_count + 1;
    *pnVar2 = pos;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_line_to(struct nk_draw_list *list, struct nk_vec2 pos)
{
    struct nk_vec2 *points = 0;
    struct nk_draw_command *cmd = 0;
    NK_ASSERT(list);
    if (!list) return;
    if (!list->cmd_count)
        nk_draw_list_add_clip(list, nk_null_rect);

    cmd = nk_draw_list_command_last(list);
    if (cmd && cmd->texture.ptr != list->config.null.texture.ptr)
        nk_draw_list_push_image(list, list->config.null.texture);

    points = nk_draw_list_alloc_path(list, 1);
    if (!points) return;
    points[0] = pos;
}